

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

Matrix3x3 * CMU462::Matrix3x3::crossProduct(Vector3D *u)

{
  double dVar1;
  double dVar2;
  Matrix3x3 *B;
  Matrix3x3 *in_RDI;
  
  in_RDI->entries[2].z = 0.0;
  in_RDI->entries[2].x = 0.0;
  in_RDI->entries[2].y = 0.0;
  in_RDI->entries[1].y = 0.0;
  in_RDI->entries[1].z = 0.0;
  in_RDI->entries[0].z = 0.0;
  in_RDI->entries[1].x = 0.0;
  in_RDI->entries[0].x = 0.0;
  in_RDI->entries[0].y = 0.0;
  dVar1 = u->z;
  in_RDI->entries[1].x = -dVar1;
  dVar2 = u->y;
  in_RDI->entries[2].x = dVar2;
  in_RDI->entries[0].y = dVar1;
  in_RDI->entries[1].y = 0.0;
  dVar1 = u->x;
  in_RDI->entries[2].y = -dVar1;
  in_RDI->entries[0].z = -dVar2;
  in_RDI->entries[1].z = dVar1;
  in_RDI->entries[2].z = 0.0;
  return in_RDI;
}

Assistant:

Matrix3x3 Matrix3x3::crossProduct( const Vector3D& u ) {
    Matrix3x3 B;

    B(0,0) =   0.;  B(0,1) = -u.z;  B(0,2) =  u.y;
    B(1,0) =  u.z;  B(1,1) =   0.;  B(1,2) = -u.x;
    B(2,0) = -u.y;  B(2,1) =  u.x;  B(2,2) =   0.;

    return B;
  }